

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_2)

{
  AssertionResult *in_RDI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_00000018;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_00000020;
  Totals *pTVar1;
  
  (in_RDI->m_info).macroName.m_start = (char *)&PTR__AssertionStats_00a1ba00;
  pTVar1 = (Totals *)&(in_RDI->m_info).macroName.m_size;
  AssertionResult::AssertionResult(in_RDI,(AssertionResult *)pTVar1);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (in_stack_00000020,in_stack_00000018);
  Totals::Totals((Totals *)in_RDI,pTVar1);
  return;
}

Assistant:

AssertionStats( AssertionStats const& )              = default;